

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetIssuance_Test::TestBody(ConfidentialTransaction_SetIssuance_Test *this)

{
  uint32_t tx_in_index;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_860;
  Message local_858;
  string local_850;
  ByteData local_830;
  string local_818;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_9;
  Message local_7e0;
  string local_7d8;
  ByteData local_7b8;
  string local_7a0;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_8;
  Message local_768;
  string local_760;
  ConfidentialValue local_740;
  string local_718;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_7;
  Message local_6e0;
  string local_6d8;
  ConfidentialValue local_6b8;
  string local_690;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_6;
  Message local_658;
  string local_650;
  ByteData256 local_630;
  string local_618;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_5;
  Message local_5e0;
  string local_5d8;
  ByteData256 local_5b8;
  string local_5a0;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_4;
  Message local_568;
  string local_560;
  Script local_540;
  string local_508;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_3;
  Message local_4d0;
  string local_4c8;
  Txid local_4a8;
  string local_488;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_2;
  Message local_450;
  uint32_t local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_1;
  Message local_428;
  uint32_t local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar;
  Message local_400;
  ConfidentialTxInReference local_3f8;
  undefined1 local_298 [8];
  ConfidentialTxInReference txin;
  Message local_130;
  ByteData local_128;
  ByteData local_110;
  ConfidentialValue local_f8;
  ConfidentialValue local_d0;
  ByteData256 local_a8;
  ByteData256 local_90;
  AssertHelper local_78;
  Message local_70 [3];
  uint32_t local_54;
  undefined1 local_50 [4];
  uint32_t index;
  ConfidentialTransaction tx;
  ConfidentialTransaction_SetIssuance_Test *this_local;
  
  tx.vout_.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_50,&exp_tx_hex_abi_cxx11_);
  local_54 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_54 = cfd::core::ConfidentialTransaction::AddTxIn
                           ((ConfidentialTransaction *)local_50,&exp_txid,2,0xfffffffe,&exp_script);
    }
  }
  else {
    testing::Message::Message(local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x10b,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(local_70);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    tx_in_index = local_54;
    if (bVar1) {
      cfd::core::ByteData256::ByteData256(&local_90,&exp_blinding_nonce);
      cfd::core::ByteData256::ByteData256(&local_a8,&exp_asset_entropy);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_d0,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_f8,&exp_inflation_keys);
      cfd::core::ByteData::ByteData(&local_110,&exp_issuance_amount_rangeproof);
      cfd::core::ByteData::ByteData(&local_128,&exp_inflation_keys_rangeproof);
      cfd::core::ConfidentialTransaction::SetIssuance
                ((ConfidentialTransaction *)local_50,tx_in_index,&local_90,&local_a8,&local_d0,
                 &local_f8,&local_110,&local_128);
      cfd::core::ByteData::~ByteData(&local_128);
      cfd::core::ByteData::~ByteData(&local_110);
      cfd::core::ConfidentialValue::~ConfidentialValue(&local_f8);
      cfd::core::ConfidentialValue::~ConfidentialValue(&local_d0);
      cfd::core::ByteData256::~ByteData256(&local_a8);
      cfd::core::ByteData256::~ByteData256(&local_90);
    }
  }
  else {
    testing::Message::Message(&local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txin.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x111,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txin.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_130);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txin.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_130);
  }
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
            ((ConfidentialTxInReference *)local_298);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxIn(&local_3f8,(ConfidentialTransaction *)local_50,1);
      cfd::core::ConfidentialTxInReference::operator=
                ((ConfidentialTxInReference *)local_298,&local_3f8);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_3f8);
    }
  }
  else {
    testing::Message::Message(&local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x114,
               "Expected: (txin = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_400);
  }
  local_41c = cfd::core::AbstractTxInReference::GetVout((AbstractTxInReference *)local_298);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_418,"txin.GetVout()","exp_index",&local_41c,&exp_index);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  local_444 = cfd::core::AbstractTxInReference::GetSequence((AbstractTxInReference *)local_298);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_440,"txin.GetSequence()","exp_sequence",&local_444,
             &exp_sequence);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  cfd::core::AbstractTxInReference::GetTxid(&local_4a8,(AbstractTxInReference *)local_298);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_488,&local_4a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_(&local_4c8,&exp_txid);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_468,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_488);
  cfd::core::Txid::~Txid(&local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  cfd::core::AbstractTxInReference::GetUnlockingScript
            (&local_540,(AbstractTxInReference *)local_298);
  cfd::core::Script::GetHex_abi_cxx11_(&local_508,&local_540);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_560,&exp_script);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4e8,"txin.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_508);
  cfd::core::Script::~Script(&local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  cfd::core::ConfidentialTxInReference::GetBlindingNonce
            (&local_5b8,(ConfidentialTxInReference *)local_298);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_5a0,&local_5b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_5d8,&exp_blinding_nonce);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_580,"txin.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_5a0);
  cfd::core::ByteData256::~ByteData256(&local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  cfd::core::ConfidentialTxInReference::GetAssetEntropy
            (&local_630,(ConfidentialTxInReference *)local_298);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_618,&local_630);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_650,&exp_asset_entropy);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5f8,"txin.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_618);
  cfd::core::ByteData256::~ByteData256(&local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  cfd::core::ConfidentialTxInReference::GetIssuanceAmount
            (&local_6b8,(ConfidentialTxInReference *)local_298);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_690,&local_6b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_6d8,&exp_issuance_amount);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_670,"txin.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_690);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_6b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  cfd::core::ConfidentialTxInReference::GetInflationKeys
            (&local_740,(ConfidentialTxInReference *)local_298);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_718,&local_740);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_760,&exp_inflation_keys);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6f8,"txin.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_718);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_768);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  cfd::core::ConfidentialTxInReference::GetIssuanceAmountRangeproof
            (&local_7b8,(ConfidentialTxInReference *)local_298);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_7a0,&local_7b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_7d8,&exp_issuance_amount_rangeproof);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_780,"txin.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7a0);
  cfd::core::ByteData::~ByteData(&local_7b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_7e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x124,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_7e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  cfd::core::ConfidentialTxInReference::GetInflationKeysRangeproof
            (&local_830,(ConfidentialTxInReference *)local_298);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_818,&local_830);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_850,&exp_inflation_keys_rangeproof);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7f8,"txin.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_818);
  cfd::core::ByteData::~ByteData(&local_830);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(&local_858);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_860,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=(&local_860,&local_858);
    testing::internal::AssertHelper::~AssertHelper(&local_860);
    testing::Message::~Message(&local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)local_298);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetIssuance) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));

  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));

  ConfidentialTxInReference txin;
  EXPECT_NO_THROW((txin = tx.GetTxIn(1)));

  EXPECT_EQ(txin.GetVout(), exp_index);
  EXPECT_EQ(txin.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txin.GetBlindingNonce().GetHex().c_str(),
               exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin.GetAssetEntropy().GetHex().c_str(),
               exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmount().GetHex().c_str(),
               exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeys().GetHex().c_str(),
               exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmountRangeproof().GetHex().c_str(),
               exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeysRangeproof().GetHex().c_str(),
               exp_inflation_keys_rangeproof.GetHex().c_str());
}